

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

size_t kvtree_pack_size(kvtree *hash)

{
  size_t sVar1;
  kvtree_elem *local_20;
  kvtree_elem *elem;
  size_t size;
  kvtree *hash_local;
  
  if (hash == (kvtree *)0x0) {
    elem = (kvtree_elem *)0x4;
  }
  else {
    elem = (kvtree_elem *)0x4;
    for (local_20 = hash->lh_first; local_20 != (kvtree_elem *)0x0;
        local_20 = (local_20->pointers).le_next) {
      sVar1 = kvtree_elem_pack_size(local_20);
      elem = (kvtree_elem *)((long)&elem->key + sVar1);
    }
  }
  return (size_t)elem;
}

Assistant:

size_t kvtree_pack_size(const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* add the size required to store the COUNT */
    size += sizeof(uint32_t);

    /* finally add the size of each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack_size(elem);
    }
  } else {
    size += sizeof(uint32_t);
  }
  return size;
}